

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
get_histogram<unsigned_int,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,size_t size)

{
  size_t __n;
  bool bVar1;
  reference pcVar2;
  byte *pbVar3;
  reference pvVar4;
  size_t s;
  char c;
  allocator<unsigned_int> local_42;
  undefined1 local_41;
  char *local_40;
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  size_t local_28;
  size_t size_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *hist;
  
  local_28 = size;
  size_local = (size_t)end._M_current;
  end_local._M_current = begin._M_current;
  if (size == 0) {
    local_40 = end._M_current;
    local_38 = begin._M_current;
    local_30 = std::max_element<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end)
    ;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    local_28 = (long)*pcVar2 + 1;
  }
  __n = local_28;
  local_41 = 0;
  std::allocator<unsigned_int>::allocator(&local_42);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_42);
  std::allocator<unsigned_int>::~allocator(&local_42);
  while (bVar1 = __gnu_cxx::operator!=
                           (&end_local,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&size_local), bVar1) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&end_local);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)*pbVar3);
    *pvVar4 = *pvVar4 + 1;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&end_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> get_histogram(Iterator begin, Iterator end, std::size_t size = 0) {
    if (size == 0)
        size = static_cast<std::size_t>(*std::max_element(begin, end)) + 1;
    std::vector<T> hist(size);

    while (begin != end) {
        char c = *begin;
        std::size_t s = (unsigned char)c;
        ++hist[s];
        ++begin;
    }

    return hist;
}